

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

void __thiscall flow::lang::Lexer::Lexer(Lexer *this,Report *report)

{
  Report *report_local;
  Lexer *this_local;
  
  this->report_ = report;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->contexts_).
  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ::list(&this->contexts_);
  this->currentChar_ = -1;
  this->ipv6HexDigits_ = 0;
  SourceLocation::SourceLocation(&this->lastLocation_);
  SourceLocation::SourceLocation(&this->location_);
  this->token_ = Eof;
  std::__cxx11::string::string((string *)&this->stringValue_);
  util::IPAddress::IPAddress(&this->ipValue_);
  this->numberValue_ = 0;
  this->interpolationDepth_ = 0;
  return;
}

Assistant:

Lexer::Lexer(diagnostics::Report* report)
    : report_{*report},
      contexts_(),
      currentChar_(EOF),
      ipv6HexDigits_(0),
      location_(),
      token_(Token::Eof),
      stringValue_(),
      ipValue_(),
      numberValue_(0),
      interpolationDepth_(0) {}